

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O1

_Bool memory_region_access_valid_sparc64
                (uc_struct_conflict9 *uc,MemoryRegion *mr,hwaddr addr,uint size,_Bool is_write,
                MemTxAttrs attrs)

{
  uint uVar1;
  _func__Bool_uc_struct_ptr_void_ptr_hwaddr_uint__Bool_MemTxAttrs_conflict15 *p_Var2;
  MemoryRegionOps *pMVar3;
  _Bool _Var4;
  MemTxAttrs unaff_EBX;
  
  p_Var2 = (mr->ops->valid).accepts;
  if (((p_Var2 == (_func__Bool_uc_struct_ptr_void_ptr_hwaddr_uint__Bool_MemTxAttrs_conflict15 *)0x0)
      || (_Var4 = (*p_Var2)((uc_struct_conflict15 *)uc,mr->opaque,addr,size,is_write,unaff_EBX),
         _Var4)) &&
     ((pMVar3 = mr->ops, (pMVar3->valid).unaligned != false || ((size - 1 & (uint)addr) == 0)))) {
    uVar1 = (pMVar3->valid).max_access_size;
    if (uVar1 == 0) {
      return true;
    }
    if (size <= uVar1) {
      return (pMVar3->valid).min_access_size <= size;
    }
  }
  return false;
}

Assistant:

bool memory_region_access_valid(struct uc_struct *uc, MemoryRegion *mr,
                                hwaddr addr,
                                unsigned size,
                                bool is_write,
                                MemTxAttrs attrs)
{
    if (mr->ops->valid.accepts
        && !mr->ops->valid.accepts(uc, mr->opaque, addr, size, is_write, attrs)) {
        return false;
    }

    if (!mr->ops->valid.unaligned && (addr & (size - 1))) {
        return false;
    }

    /* Treat zero as compatibility all valid */
    if (!mr->ops->valid.max_access_size) {
        return true;
    }

    if (size > mr->ops->valid.max_access_size
        || size < mr->ops->valid.min_access_size) {
        return false;
    }
    return true;
}